

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall
kws::Parser::IsBetweenQuoteChar
          (Parser *this,size_t pos,bool withComments,string *buffer,char quoteChar)

{
  bool bVar1;
  ulong uVar2;
  Parser *this_00;
  string *in_RCX;
  byte in_DL;
  Parser *in_RSI;
  size_t in_RDI;
  char in_R8B;
  size_t b1;
  size_t b0;
  string stream;
  byte local_88;
  byte local_86;
  byte local_83;
  byte local_81;
  Parser *in_stack_ffffffffffffff90;
  Parser *local_68;
  string local_50 [39];
  char local_29;
  byte local_19;
  Parser *local_18;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_29 = in_R8B;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_50,(string *)in_RCX);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (std::__cxx11::string::operator=(local_50,(string *)(in_RDI + 0x518)), (local_19 & 1) != 0)) {
    std::__cxx11::string::operator=(local_50,(string *)(in_RDI + 0x4f8));
  }
  if (local_18 == (Parser *)0xffffffffffffffff) {
    local_1 = 0;
  }
  else {
    local_68 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
    while( true ) {
      local_81 = 0;
      if (local_68 != (Parser *)0xffffffffffffffff) {
        bVar1 = IsValidQuote(in_stack_ffffffffffffff90,in_RCX,in_RDI);
        local_81 = bVar1 ^ 0xff;
      }
      if ((local_81 & 1) == 0) break;
      local_68 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
    }
    this_00 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
    while( true ) {
      local_83 = 0;
      if (this_00 != (Parser *)0xffffffffffffffff) {
        bVar1 = IsValidQuote(this_00,in_RCX,in_RDI);
        local_83 = bVar1 ^ 0xff;
      }
      if ((local_83 & 1) == 0) break;
      this_00 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
    }
    while( true ) {
      bVar1 = false;
      if ((local_68 != (Parser *)0xffffffffffffffff) &&
         (bVar1 = false, this_00 != (Parser *)0xffffffffffffffff)) {
        bVar1 = local_68 < this_00;
      }
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0013a095;
      }
      if ((local_68 < local_18) && (local_18 < this_00)) break;
      local_68 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
      while( true ) {
        local_86 = 0;
        if (local_68 != (Parser *)0xffffffffffffffff) {
          bVar1 = IsValidQuote(this_00,in_RCX,in_RDI);
          local_86 = bVar1 ^ 0xff;
        }
        if ((local_86 & 1) == 0) break;
        local_68 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
      }
      this_00 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
      while( true ) {
        local_88 = 0;
        if (this_00 != (Parser *)0xffffffffffffffff) {
          bVar1 = IsValidQuote(this_00,in_RCX,in_RDI);
          local_88 = bVar1 ^ 0xff;
        }
        if ((local_88 & 1) == 0) break;
        this_00 = (Parser *)std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)local_29);
      }
    }
    local_1 = 1;
  }
LAB_0013a095:
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::IsBetweenQuoteChar(size_t pos,bool withComments,std::string buffer, char quoteChar) const
{
  std::string stream = buffer;

  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  // We don't want to check for \" otherwise it fails
  size_t b0 = stream.find(quoteChar,0);
  while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
    {
    b0 = stream.find(quoteChar,b0+1);
    }

  size_t b1 = stream.find(quoteChar,b0+1);
  while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
    {
    b1 = stream.find(quoteChar,b1+1);
    }

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(quoteChar,b1+1);
    while((b0!=std::string::npos) && !this->IsValidQuote(stream,b0))
      {
      b0 = stream.find(quoteChar,b0+1);
      }

    b1 = stream.find(quoteChar,b0+1);
    while((b1!=std::string::npos) && !this->IsValidQuote(stream,b1))
      {
      b1 = stream.find(quoteChar,b1+1);
      }
    }
  return false;
}